

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O1

tuple<double,_double,_double> * __thiscall
ear::ScreenEdgeLockHandler::handleVector
          (tuple<double,_double,_double> *__return_storage_ptr__,ScreenEdgeLockHandler *this,
          Vector3d *pos,ScreenEdgeLock *screenEdgeLock)

{
  not_implemented *this_00;
  string local_40;
  
  if (((screenEdgeLock->horizontal).super_type.m_initialized == false) &&
     ((screenEdgeLock->vertical).super_type.m_initialized != true)) {
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
    super__Head_base<2UL,_double,_false>._M_head_impl =
         (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2];
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
         (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [1];
    (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_double,_double>).
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
    return __return_storage_ptr__;
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"screenEdgeLock","");
  not_implemented::not_implemented(this_00,&local_40);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::tuple<double, double, double> handleVector(
        Eigen::Vector3d pos, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_tuple(pos(0), pos(1), pos(2));
    }